

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall Instance::print(Instance *this)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int j;
  int i;
  long lVar5;
  
  puts("Instance:");
  lVar3 = 0;
  lVar1 = 0;
  while (lVar5 = lVar1, lVar5 < this->m) {
    uVar4 = 0;
    printf("i=%d (nopts: %d, demand: %d)\n",lVar5 + 1,
           (ulong)(uint)(this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar5],
           (ulong)(uint)(this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar5]);
    lVar3 = (long)(int)lVar3;
    while (lVar1 = lVar5 + 1,
          (int)uVar4 <
          (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5]) {
      uVar4 = (ulong)((int)uVar4 + 1);
      printf("  opt=%d: (",uVar4);
      for (i = 0; i < this->ndims; i = i + 1) {
        if (i != 0) {
          printf(", ");
        }
        uVar2 = Item::operator[]((this->items).super__Vector_base<Item,_std::allocator<Item>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar3,i);
        printf("%d",(ulong)uVar2);
      }
      puts(")");
      lVar3 = lVar3 + 1;
    }
  }
  return;
}

Assistant:

void Instance::print() const {
	printf("Instance:\n");
	int p = 0;
	for (int i = 0; i < m; i++) {
		printf("i=%d (nopts: %d, demand: %d)\n", i + 1, nopts[i], demands[i]);
		for (int q = 0; q < nopts[i]; q++) {
			printf("  opt=%d: (", q + 1);
			for (int j = 0; j < ndims; j++) {
				if (j) {
					printf(", ");
				}
				printf("%d", items[p][j]);
			}
			printf(")\n");
			p++;
		}
	}
}